

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::setTextInRange(File *this,Range *oldRange,u16string *text)

{
  uint32_t uVar1;
  TSPoint TVar2;
  TSPoint TVar3;
  size_type sVar4;
  undefined1 local_d4 [8];
  TSInputEdit edit;
  TSPoint newEndPoint;
  TSPoint end;
  uint32_t local_80;
  uint32_t uStack_7c;
  TSPoint start;
  undefined1 local_68 [8];
  u16string oldText;
  uint32_t local_40;
  uint32_t startByte;
  u16string *text_local;
  Range *oldRange_local;
  File *this_local;
  
  if ((this->hasParser & 1U) != 0) {
    join_0x00000010_0x00000000_ = TextBuffer::clip_position(&this->buffer,oldRange->start);
    uVar1 = local_40 * 2;
    TextBuffer::text_in_range_abi_cxx11_((u16string *)local_68,&this->buffer,*oldRange);
    TVar2 = toTSPoint(oldRange->start);
    TVar3 = toTSPoint(oldRange->end);
    edit.new_end_point = TSEndPointOfText(text);
    if (edit.new_end_point.row == 0) {
      uStack_7c = TVar2.column;
      edit.new_end_point = (TSPoint)((ulong)(uStack_7c + edit.new_end_point.column) << 0x20);
    }
    local_80 = TVar2.row;
    edit.new_end_point.row = edit.new_end_point.row + local_80;
    local_d4._0_4_ = uVar1;
    sVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::length
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)local_68);
    local_d4._4_4_ = uVar1 + (int)sVar4 * 2;
    sVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::length
                      (text);
    edit.start_byte = uVar1 + (int)sVar4 * 2;
    edit.old_end_point = edit.new_end_point;
    edit._4_8_ = TVar2;
    edit.start_point = TVar3;
    ts_tree_edit(this->tree,(TSInputEdit *)local_d4);
    std::__cxx11::u16string::~u16string((u16string *)local_68);
  }
  TextBuffer::set_text_in_range(&this->buffer,*oldRange,text);
  if ((this->hasParser & 1U) != 0) {
    executeParse(this);
  }
  return;
}

Assistant:

void File::setTextInRange (Range &oldRange, std::u16string &&text) {
    if (hasParser) {
        uint32_t startByte = buffer.clip_position(oldRange.start).offset << 1;

        u16string oldText = buffer.text_in_range(oldRange);

        TSPoint start = toTSPoint(oldRange.start);
        TSPoint end = toTSPoint(oldRange.end);

        TSPoint newEndPoint = TSEndPointOfText(text);

        if (newEndPoint.row == 0) {
            newEndPoint.column += start.column;
        }

        newEndPoint.row += start.row;

        TSInputEdit edit = {
                startByte, // start byte
                startByte + (static_cast<uint32_t>(oldText.length()) << 1), // old end byte
                startByte + (static_cast<uint32_t>(text.length()) << 1), // new end byte
                start, // start point
                end, // old end point
                newEndPoint // new end point
        };

//        std::cerr << "TSEDIT\n";
//        std::cerr << "old text: " << UtfHandler().utf16to8(oldText) << "\n";
//        std::cerr << "new text: " << UtfHandler().utf16to8(text) << "\n";
//        std::cerr << "startByte: " << startByte << "\n";
//        std::cerr << "old end byte: " << edit.old_end_byte << "\n";
//        std::cerr << "new end byte: " << edit.new_end_byte << "\n";
//        std::cerr << "start point: " << edit.start_point.row << ":" << edit.start_point.column << "\n";
//        std::cerr << "old end point: " << edit.old_end_point.row << ":" << edit.old_end_point.column << "\n";
//        std::cerr << "new end point: " << edit.new_end_point.row << ":" << edit.new_end_point.column << "\n";

        ts_tree_edit(tree, &edit);
    }

    buffer.set_text_in_range(oldRange, move(text));

    if (hasParser) {
        executeParse();
    }
}